

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_object.hpp
# Opt level: O0

void __thiscall
webfront::http::std::experimental::net::v1::
basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
::basic_io_object(basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
                  *this,io_context *io_context)

{
  io_context_impl *piVar1;
  resolver_service_base *in_RDI;
  implementation_type *in_stack_ffffffffffffffc8;
  
  piVar1 = (io_context_impl *)
           ::std::experimental::net::v1::
           use_service<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>>
                     ((io_context *)0x1195c2);
  in_RDI->io_context_impl_ = piVar1;
  shared_ptr<void>::shared_ptr((shared_ptr<void> *)0x1195d8);
  detail::resolver_service_base::construct(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

explicit basic_io_object(std::experimental::net::v1::io_context& io_context)
    : service_(&std::experimental::net::v1::use_service<IoObjectService>(io_context))
  {
    service_->construct(implementation_);
  }